

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool arm_pre_translate_insn(DisasContext_conflict1 *dc)

{
  _Bool _Var1;
  
  if ((dc->ss_active == true) && (dc->pstate_ss == false)) {
    if ((dc->base).num_insns != 1) {
      __assert_fail("dc->base.num_insns == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.c"
                    ,0x2c8b,"_Bool arm_pre_translate_insn(DisasContext *)");
    }
    gen_swstep_exception(dc,0,0);
    (dc->base).is_jmp = DISAS_NORETURN;
    _Var1 = true;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool arm_pre_translate_insn(DisasContext *dc)
{
    if (dc->ss_active && !dc->pstate_ss) {
        /* Singlestep state is Active-pending.
         * If we're in this state at the start of a TB then either
         *  a) we just took an exception to an EL which is being debugged
         *     and this is the first insn in the exception handler
         *  b) debug exceptions were masked and we just unmasked them
         *     without changing EL (eg by clearing PSTATE.D)
         * In either case we're going to take a swstep exception in the
         * "did not step an insn" case, and so the syndrome ISV and EX
         * bits should be zero.
         */
        assert(dc->base.num_insns == 1);
        gen_swstep_exception(dc, 0, 0);
        dc->base.is_jmp = DISAS_NORETURN;
        return true;
    }

    return false;
}